

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> * __thiscall
embree::XMLLoader::loadBinary<std::vector<embree::Vec3<float>,std::allocator<embree::Vec3<float>>>>
          (vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
           *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XML *pXVar2;
  pointer pVVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *pvVar6;
  long __off;
  size_type __n;
  size_type sVar7;
  long *plVar8;
  runtime_error *prVar9;
  size_type *psVar10;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *data;
  string local_98;
  string local_78;
  vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = __return_storage_ptr__;
  if (this->binFile == (FILE *)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar4 = (this->binFileName).filename._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,pcVar4 + (this->binFileName).filename._M_string_length);
    std::operator+(&local_98,"cannot open file ",&local_50);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_98);
    local_78._M_dataplus._M_p = (pointer)*plVar8;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_78._M_dataplus._M_p == psVar10) {
      local_78.field_2._M_allocated_capacity = *psVar10;
      local_78.field_2._8_8_ = plVar8[3];
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar10;
    }
    local_78._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::runtime_error::runtime_error(prVar9,(string *)&local_78);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pXVar2 = xml->ptr;
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ofs","");
  XML::parm(&local_78,pXVar2,&local_98);
  _Var5._M_p = local_78._M_dataplus._M_p;
  __off = atol(local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != &local_78.field_2) {
    operator_delete(_Var5._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  fseek((FILE *)this->binFile,__off,0);
  pXVar2 = xml->ptr;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"size","");
  XML::parm(&local_78,pXVar2,&local_98);
  _Var5._M_p = local_78._M_dataplus._M_p;
  __n = atol(local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != &local_78.field_2) {
    operator_delete(_Var5._M_p);
  }
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (__n == 0) {
    pXVar2 = xml->ptr;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"num","");
    XML::parm(&local_78,pXVar2,&local_98);
    __n = atol(local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  pvVar6 = local_58;
  if (__off + __n * 0xc <= this->binFileSize) {
    std::vector<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>::vector
              (local_58,__n,(allocator_type *)&local_78);
    pVVar3 = (pvVar6->super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    sVar7 = __fread_chk(pVVar3,0xffffffffffffffff,0xc,
                        ((long)(pvVar6->
                               super__Vector_base<embree::Vec3<float>,_std::allocator<embree::Vec3<float>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 2) *
                        -0x5555555555555555,this->binFile);
    if (__n == sVar7) {
      return pvVar6;
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar4 = (this->binFileName).filename._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar4,pcVar4 + (this->binFileName).filename._M_string_length);
    std::operator+(&local_78,"error reading from binary file: ",&local_98);
    std::runtime_error::runtime_error(prVar9,(string *)&local_78);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar4 = (this->binFileName).filename._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar4,pcVar4 + (this->binFileName).filename._M_string_length);
  std::operator+(&local_78,"error reading from binary file: ",&local_98);
  std::runtime_error::runtime_error(prVar9,(string *)&local_78);
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vector XMLLoader::loadBinary(const Ref<XML>& xml)
  {
    if (!binFile) 
      THROW_RUNTIME_ERROR("cannot open file "+binFileName.str()+" for reading");

    size_t ofs = atol(xml->parm("ofs").c_str());
    fseek(binFile,long(ofs),SEEK_SET);

    /* read size of array */
    size_t size = atol(xml->parm("size").c_str());
    if (size == 0) size = atol(xml->parm("num").c_str()); // version for BGF format

    /* perform security check that we stay in the file */
    if (ofs + size*sizeof(typename Vector::value_type) > binFileSize)
      THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());

    /* read data from file */
    Vector data(size);
    if (size != fread(data.data(), sizeof(typename Vector::value_type), data.size(), binFile)) 
      THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());

    return data;
  }